

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media-adv.c
# Opt level: O3

la_proto_node * la_media_adv_parse(char *txt)

{
  char cVar1;
  byte bVar2;
  undefined1 *puVar3;
  la_proto_node *plVar4;
  size_t sVar5;
  void *pvVar6;
  ushort **ppuVar7;
  la_vstring *plVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  char *pcVar12;
  
  if (txt == (char *)0x0) {
    plVar4 = (la_proto_node *)0x0;
  }
  else {
    puVar3 = (undefined1 *)
             la_xcalloc(1,0x38,
                        "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/media-adv.c"
                        ,0x33,"la_media_adv_parse");
    *puVar3 = 1;
    plVar4 = la_proto_node_new();
    plVar4->data = puVar3;
    plVar4->td = &la_DEF_media_adv_message;
    plVar4->next = (la_proto_node *)0x0;
    sVar5 = strlen(txt);
    if ((9 < sVar5) && (cVar1 = *txt, puVar3[1] = cVar1 + -0x30, (char)(cVar1 + -0x30) == '\0')) {
      cVar1 = txt[1];
      puVar3[5] = cVar1;
      if ((cVar1 == 'L') || (cVar1 == 'E')) {
        cVar1 = txt[2];
        puVar3[6] = cVar1;
        pvVar6 = memchr("VSHGC2XI",(int)cVar1,9);
        if (pvVar6 != (void *)0x0) {
          ppuVar7 = __ctype_b_loc();
          lVar10 = -6;
          do {
            if ((*(byte *)((long)*ppuVar7 + (long)txt[lVar10 + 9] * 2 + 1) & 8) == 0) {
              return plVar4;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0);
          bVar11 = (txt[3] * '\n' + txt[4]) - 0x10;
          puVar3[2] = bVar11;
          bVar2 = (txt[5] * '\n' + txt[6]) - 0x10;
          puVar3[3] = bVar2;
          bVar9 = (txt[7] * '\n' + txt[8]) - 0x10;
          puVar3[4] = bVar9;
          if ((bVar11 < 0x18) && (bVar9 < 0x3c && bVar2 < 0x3c)) {
            plVar8 = la_vstring_new();
            *(la_vstring **)(puVar3 + 8) = plVar8;
            for (pcVar12 = txt + 10; cVar1 = pcVar12[-1], cVar1 != '\0'; pcVar12 = pcVar12 + 1) {
              if (cVar1 == '/') {
                if (*pcVar12 != '\0') {
                  pcVar12 = strdup(pcVar12);
                  *(char **)(puVar3 + 0x10) = pcVar12;
                }
                break;
              }
              pvVar6 = memchr("VSHGC2XI",(int)cVar1,9);
              if (pvVar6 == (void *)0x0) {
                return plVar4;
              }
              la_vstring_append_buffer(*(la_vstring **)(puVar3 + 8),pcVar12 + -1,1);
            }
            *puVar3 = 0;
          }
        }
      }
    }
  }
  return plVar4;
}

Assistant:

la_proto_node *la_media_adv_parse(char const *txt) {
	if(txt == NULL) {
		return NULL;
	}

	LA_NEW(la_media_adv_msg, msg);
	msg->err = true;

	la_proto_node *node = la_proto_node_new();
	node->data = msg;
	node->td = &la_DEF_media_adv_message;
	node->next = NULL;

	if(strlen(txt) < 10) {
		goto end;
	}
	msg->version = txt[0] - '0';
	if(msg->version != 0) {
		goto end;
	}
	msg->state = txt[1];
	if(msg->state != 'E' && msg->state != 'L') {
		goto end;
	}
	msg->current_link = txt[2];
	if(!is_valid_link(msg->current_link)) {
		goto end;
	}
	for(size_t i = 3; i < 9; i++) {
		if(!isdigit(txt[i])) {
			goto end;
		}
	}
	msg->hour = ATOI2(txt[3], txt[4]);
	msg->minute = ATOI2(txt[5], txt[6]);
	msg->second = ATOI2(txt[7], txt[8]);
	if(msg->hour > 23 || msg->minute > 59 || msg->second > 59) {
		goto end;
	}
	txt += 9;
	msg->available_links = la_vstring_new();
	// Copy all link until / character or end of string
	for(; *txt != '/' && *txt != '\0'; txt++) {
		if(is_valid_link(*txt)) {
			la_vstring_append_buffer(msg->available_links, txt, 1);
		} else {
			goto end;
		}
	}
	if(txt[0] == '/' && txt[1] != '\0') {
		msg->text = strdup(txt + 1);
	}
	msg->err = false;
end:
	return node;
}